

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DestListEntryArray.cpp
# Opt level: O2

void __thiscall DestListEntryArray::printDestListEntryArray(DestListEntryArray *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_180;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_150;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_120;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_108;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_f0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_______________________DestList__________________________");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->destListEntryArray).
                             super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->destListEntryArray).
                            super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x168); uVar4 = uVar4 + 1)
  {
    poVar2 = std::operator<<((ostream *)&std::cout,"DestListEntry ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar4 + 1);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"  Checksum:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Checksum).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_138);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_138);
    std::operator<<((ostream *)&std::cout,"  VolumeId:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->VolumeId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"  ObjectId:                         ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ObjectId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"     Birth Mac:                     ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ObjectId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::printMacAddr((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
    poVar2 = std::operator<<((ostream *)&std::cout,"     Sequence Number:               ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ObjectId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    iVar1 = Utils::lenTwoBytesFromPos
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150,8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_150);
    std::operator<<((ostream *)&std::cout,"  BirthVolumeId:                    ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->BirthVolumeId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"  BirthObjectId:                    ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->BirthObjectId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::printSid((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_a8);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout,"  NetBIOSName:                      ");
    Utils::print_vec_unicode
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->NetBIOSName).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    poVar2 = std::operator<<((ostream *)&std::cout,"  EntryId:                          ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->EntryId).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_168);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_168);
    std::operator<<((ostream *)&std::cout,"  Reserved1:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Reserved1).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_c0);
    std::operator<<((ostream *)&std::cout,"  MSFileTime:                       ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->MSFileTime).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::getDateFromPos((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_d8,0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_d8);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&Utils::defaultOffsetDocInfo_abi_cxx11_
                            );
    poVar2 = std::operator<<(poVar2," Time of last recorded access.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"  EntryPinStatus:                   ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->EntryPinStatus).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f0);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_f0);
    std::operator<<((ostream *)&std::cout,"  Reserved2:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Reserved2).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_108);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_108);
    poVar2 = std::operator<<((ostream *)&std::cout,"  AccessedCount:                    ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_180,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->AccessedCount).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::lenFourBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_180);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_180);
    std::operator<<((ostream *)&std::cout,"  Reserved3:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Reserved3).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_120);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_120);
    poVar2 = std::operator<<((ostream *)&std::cout,"  LengthOfUnicodeData:              ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->LengthOfUnicodeData).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    iVar1 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_198);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 * 2);
    poVar2 = std::operator<<(poVar2," bytes");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_198);
    std::operator<<((ostream *)&std::cout,"  EntryStringData:                  ");
    Utils::print_vec_unicode
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->destListEntryArray).
                         super__Vector_base<DestListEntryArray::DestListEntry,_std::allocator<DestListEntryArray::DestListEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start)->EntryStringData).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + lVar3));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar3 = lVar3 + 0x168;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void DestListEntryArray::printDestListEntryArray() {
    cout << "_______________________DestList__________________________" << endl;
    for(int i = 0; i < destListEntryArray.size(); ++i) {
        cout << "DestListEntry " << dec << i + 1 << endl;
        cout << "  Checksum:                         "; Utils::print_vec(destListEntryArray[i].Checksum);
        cout << "  VolumeId:                         "; Utils::printSid(destListEntryArray[i].VolumeId, 0); cout << endl;
        cout << "  ObjectId:                         "; Utils::printSid(destListEntryArray[i].ObjectId, 0); cout << endl;
        cout << "     Birth Mac:                     "; Utils::printMacAddr(destListEntryArray[i].ObjectId, 0);

        cout << "     Sequence Number:               " <<
            dec << Utils::lenTwoBytesFromPos(destListEntryArray[i].ObjectId, 8) << endl;
//        cout << "     Creation Date:                 "; Utils::getDateFromPos(destListEntryArray[i].ObjectId, 0);
        cout << "  BirthVolumeId:                    "; Utils::printSid(destListEntryArray[i].BirthVolumeId, 0); cout << endl;
        cout << "  BirthObjectId:                    "; Utils::printSid(destListEntryArray[i].BirthObjectId, 0); cout << endl;
        cout << "  NetBIOSName:                      "; Utils::print_vec_unicode(destListEntryArray[i].NetBIOSName);
        cout << "  EntryId:                          " << dec << Utils::lenFourBytes(destListEntryArray[i].EntryId) << endl;
        cout << "  Reserved1:                        "; Utils::print_vec(destListEntryArray[i].Reserved1);
        cout << "  MSFileTime:                       "; Utils::getDateFromPos(destListEntryArray[i].MSFileTime, 0);
            cout << Utils::defaultOffsetDocInfo << " Time of last recorded access." << endl;
        cout << "  EntryPinStatus:                   "; Utils::print_vec(destListEntryArray[i].EntryPinStatus);
        cout << "  Reserved2:                        "; Utils::print_vec(destListEntryArray[i].Reserved2);
        cout << "  AccessedCount:                    " << dec << Utils::lenFourBytes(destListEntryArray[i].AccessedCount) << endl;
        cout << "  Reserved3:                        "; Utils::print_vec(destListEntryArray[i].Reserved3);
        cout << "  LengthOfUnicodeData:              "<< dec <<
            2 * Utils::lenTwoBytes(destListEntryArray[i].LengthOfUnicodeData) << " bytes" << endl;
        cout << "  EntryStringData:                  "; Utils::print_vec_unicode(destListEntryArray[i].EntryStringData);
        cout << endl;
    }
    cout << "_________________________________________________________" << endl;
}